

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SafeInt.hpp
# Opt level: O0

bool AdditionHelper<long,_signed_char,_10>::Addition(long *lhs,char *rhs,long *result)

{
  long lVar1;
  int64_t tmp;
  long *result_local;
  char *rhs_local;
  long *lhs_local;
  
  lVar1 = *lhs + (long)*rhs;
  if (*lhs < 0) {
    if ((*rhs < '\0') && (*lhs < lVar1)) {
      return false;
    }
  }
  else if ((-1 < *rhs) && (lVar1 < *lhs)) {
    return false;
  }
  *result = lVar1;
  return true;
}

Assistant:

static bool Addition( const T& lhs, const U& rhs, T& result ) SAFEINT_NOTHROW
    {
        // lhs is std::int64_t, rhs signed
        std::int64_t tmp = (std::int64_t)((std::uint64_t)lhs + (std::uint64_t)rhs);

        if( lhs >= 0 )
        {
            // mixed sign cannot overflow
            if( rhs >= 0 && tmp < lhs )
                return false;
        }
        else
        {
            // lhs negative
            if( rhs < 0 && tmp > lhs )
                return false;
        }

        result = (T)tmp;
        return true;
    }